

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O0

void __thiscall
parlay::scheduler<parlay::WorkStealingJob>::wait_for_work(scheduler<parlay::WorkStealingJob> *this)

{
  long in_RDI;
  memory_order __b;
  type_identity_t<unsigned_long> in_stack_ffffffffffffff48;
  atomic<unsigned_long> *in_stack_ffffffffffffff50;
  
  LOCK();
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  atomic_wait<unsigned_long>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  LOCK();
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  UNLOCK();
  return;
}

Assistant:

void wait_for_work() {
    num_awake_workers.fetch_sub(1);
    parlay::atomic_wait(&wake_up_counter, wake_up_counter.load());
    num_awake_workers.fetch_add(1);
  }